

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# socket_linux.cc
# Opt level: O3

void __thiscall
rcdiscover::SocketLinux::SocketLinux
          (SocketLinux *this,int domain,int type,int protocol,in_addr_t dst_ip,uint16_t port,
          string *iface_name)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  size_type sVar2;
  int iVar3;
  OperationNotPermitted *this_00;
  SocketException *pSVar4;
  int *piVar5;
  ulong *puVar6;
  int yes;
  string local_78;
  undefined4 local_54;
  ulong *local_50;
  undefined8 local_48;
  ulong local_40;
  undefined8 uStack_38;
  
  local_50 = &local_40;
  puVar6 = (ulong *)(iface_name->_M_dataplus)._M_p;
  paVar1 = &iface_name->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)puVar6 == paVar1) {
    local_40 = paVar1->_M_allocated_capacity;
    uStack_38 = *(undefined8 *)((long)&iface_name->field_2 + 8);
    puVar6 = local_50;
  }
  else {
    local_40 = paVar1->_M_allocated_capacity;
  }
  sVar2 = iface_name->_M_string_length;
  (iface_name->_M_dataplus)._M_p = (pointer)paVar1;
  iface_name->_M_string_length = 0;
  (iface_name->field_2)._M_local_buf[0] = '\0';
  paVar1 = &(this->super_Socket<rcdiscover::SocketLinux>).iface_name_.field_2;
  (this->super_Socket<rcdiscover::SocketLinux>).iface_name_._M_dataplus._M_p = (pointer)paVar1;
  if (puVar6 == local_50) {
    paVar1->_M_allocated_capacity = local_40;
    *(undefined8 *)((long)&(this->super_Socket<rcdiscover::SocketLinux>).iface_name_.field_2 + 8) =
         uStack_38;
  }
  else {
    (this->super_Socket<rcdiscover::SocketLinux>).iface_name_._M_dataplus._M_p = (pointer)puVar6;
    (this->super_Socket<rcdiscover::SocketLinux>).iface_name_.field_2._M_allocated_capacity =
         local_40;
  }
  (this->super_Socket<rcdiscover::SocketLinux>).iface_name_._M_string_length = sVar2;
  local_48 = 0;
  local_40 = local_40 & 0xffffffffffffff00;
  this->sock_ = -1;
  (this->dst_addr_).sin_family = 0;
  (this->dst_addr_).sin_port = 0;
  (this->dst_addr_).sin_addr = 0;
  (this->dst_addr_).sin_zero[0] = '\0';
  (this->dst_addr_).sin_zero[1] = '\0';
  (this->dst_addr_).sin_zero[2] = '\0';
  (this->dst_addr_).sin_zero[3] = '\0';
  (this->dst_addr_).sin_zero[4] = '\0';
  (this->dst_addr_).sin_zero[5] = '\0';
  (this->dst_addr_).sin_zero[6] = '\0';
  (this->dst_addr_).sin_zero[7] = '\0';
  iVar3 = socket(domain,type,protocol);
  this->sock_ = iVar3;
  if (iVar3 != -1) {
    (this->dst_addr_).sin_addr.s_addr = dst_ip;
    (this->dst_addr_).sin_family = 2;
    (this->dst_addr_).sin_port = port << 8 | port >> 8;
    local_54 = 1;
    iVar3 = setsockopt(iVar3,1,0xf,&local_54,4);
    if (iVar3 != -1) {
      return;
    }
    pSVar4 = (SocketException *)__cxa_allocate_exception(0x38);
    local_78._M_dataplus._M_p = (pointer)&local_78.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_78,"Error while setting socket options","");
    piVar5 = __errno_location();
    SocketException::SocketException(pSVar4,&local_78,*piVar5);
    __cxa_throw(pSVar4,&SocketException::typeinfo,SocketException::~SocketException);
  }
  piVar5 = __errno_location();
  if (*piVar5 == 1) {
    this_00 = (OperationNotPermitted *)__cxa_allocate_exception(0x10);
    OperationNotPermitted::OperationNotPermitted(this_00);
    __cxa_throw(this_00,&OperationNotPermitted::typeinfo,std::runtime_error::~runtime_error);
  }
  pSVar4 = (SocketException *)__cxa_allocate_exception(0x38);
  local_78._M_dataplus._M_p = (pointer)&local_78.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_78,"Error while creating socket","");
  SocketException::SocketException(pSVar4,&local_78,*piVar5);
  __cxa_throw(pSVar4,&SocketException::typeinfo,SocketException::~SocketException);
}

Assistant:

SocketLinux::SocketLinux(int domain, int type, int protocol,
                         in_addr_t dst_ip, uint16_t port,
                         std::string iface_name) :
  Socket(std::move(iface_name)),
  sock_(-1),
  dst_addr_()
{
  sock_ = ::socket(domain, type, protocol);
  if (sock_ == -1)
  {
    if (errno == EPERM)
    {
      throw OperationNotPermitted();
    }

    throw SocketException("Error while creating socket", errno);
  }

  dst_addr_.sin_addr.s_addr = dst_ip;
  dst_addr_.sin_family = AF_INET;
  dst_addr_.sin_port = htons(port);

  const int yes = 1;
  if (::setsockopt(sock_,
                  SOL_SOCKET,
                  SO_REUSEPORT,
                  reinterpret_cast<const char *>(&yes),
                  sizeof(yes)) == -1)
  {
    throw SocketException("Error while setting socket options", errno);
  }
}